

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool,false,true>
               (interval_t *ldata,interval_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int64_t *piVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  idx_t iVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  int64_t *local_88;
  ulong local_80;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar3 = rdata->micros;
      lVar12._0_4_ = rdata->months;
      lVar12._4_4_ = rdata->days;
      lVar7 = (lVar12 >> 0x20) + lVar3 / 86400000000;
      local_88 = &ldata->micros;
      iVar13 = 0;
      do {
        lVar14._0_4_ = ((interval_t *)(local_88 + -1))->months;
        lVar14._4_4_ = ((interval_t *)(local_88 + -1))->days;
        lVar5 = *local_88;
        if (lVar5 == lVar3 && lVar14 == lVar12) {
          bVar16 = false;
        }
        else {
          lVar15 = (lVar14 >> 0x20) + lVar5 / 86400000000;
          bVar16 = true;
          if (((long)(int)(undefined4)lVar14 + lVar15 / 0x1e ==
               lVar7 / 0x1e + (long)(int)(undefined4)lVar12) && (lVar15 % 0x1e == lVar7 % 0x1e)) {
            bVar16 = lVar5 % 86400000000 != lVar3 % 86400000000;
          }
        }
        result_data[iVar13] = bVar16;
        iVar13 = iVar13 + 1;
        local_88 = local_88 + 2;
      } while (count != iVar13);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_80 = 0;
    uVar10 = 0;
    do {
      uVar2 = puVar1[uVar10];
      uVar11 = local_80 + 0x40;
      if (count <= local_80 + 0x40) {
        uVar11 = count;
      }
      uVar6 = uVar11;
      if (uVar2 != 0) {
        uVar6 = local_80;
        if (uVar2 == 0xffffffffffffffff) {
          if (local_80 < uVar11) {
            lVar3 = rdata->micros;
            lVar7._0_4_ = rdata->months;
            lVar7._4_4_ = rdata->days;
            lVar12 = (lVar7 >> 0x20) + lVar3 / 86400000000;
            piVar8 = &ldata[local_80].micros;
            do {
              lVar5._0_4_ = ((interval_t *)(piVar8 + -1))->months;
              lVar5._4_4_ = ((interval_t *)(piVar8 + -1))->days;
              lVar14 = *piVar8;
              if (lVar14 == lVar3 && lVar5 == lVar7) {
                bVar16 = false;
              }
              else {
                lVar15 = (lVar5 >> 0x20) + lVar14 / 86400000000;
                bVar16 = true;
                if (((long)(int)(undefined4)lVar5 + lVar15 / 0x1e ==
                     lVar12 / 0x1e + (long)(int)(undefined4)lVar7) &&
                   (lVar15 % 0x1e == lVar12 % 0x1e)) {
                  bVar16 = lVar14 % 86400000000 != lVar3 % 86400000000;
                }
              }
              result_data[local_80] = bVar16;
              local_80 = local_80 + 1;
              piVar8 = piVar8 + 2;
              uVar6 = uVar11;
            } while (uVar11 != local_80);
          }
        }
        else if (local_80 < uVar11) {
          piVar8 = &ldata[local_80].micros;
          uVar9 = 0;
          do {
            if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
              uVar6._0_4_ = ((interval_t *)(piVar8 + -1))->months;
              uVar6._4_4_ = ((interval_t *)(piVar8 + -1))->days;
              lVar3 = *piVar8;
              uVar4._0_4_ = rdata->months;
              uVar4._4_4_ = rdata->days;
              lVar12 = rdata->micros;
              if ((uVar6 >> 0x20 == uVar4 >> 0x20 && (undefined4)uVar6 == (undefined4)uVar4) &&
                 (uVar4._4_4_ = uVar6._4_4_, lVar3 == lVar12)) {
                bVar16 = false;
              }
              else {
                lVar7 = ((long)uVar6 >> 0x20) + lVar3 / 86400000000;
                lVar14 = (long)uVar4._4_4_ + lVar12 / 86400000000;
                bVar16 = true;
                if (((long)(int)(undefined4)uVar6 + lVar7 / 0x1e ==
                     (long)(int)(undefined4)uVar4 + lVar14 / 0x1e) &&
                   (lVar7 % 0x1e == lVar14 % 0x1e)) {
                  bVar16 = lVar3 % 86400000000 != lVar12 % 86400000000;
                }
              }
              result_data[uVar9 + local_80] = bVar16;
            }
            uVar9 = uVar9 + 1;
            piVar8 = piVar8 + 2;
            uVar6 = uVar11;
          } while (uVar11 - local_80 != uVar9);
        }
      }
      local_80 = uVar6;
      uVar10 = uVar10 + 1;
    } while (uVar10 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}